

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsseval.c
# Opt level: O3

void GEN(AES_KEY *key,int alpha,int n,uchar **k0,uchar **k1)

{
  undefined8 *puVar1;
  uint *puVar2;
  block alVar3;
  undefined8 uVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  long lVar9;
  undefined4 in_register_00000014;
  long lVar10;
  long lVar11;
  undefined4 in_register_00000034;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  AES_KEY *pAVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  undefined1 (*pauVar21) [16];
  undefined1 (*pauVar22) [16];
  size_t __size;
  ulong uVar23;
  bool bVar24;
  undefined8 extraout_XMM0_Qa;
  uint uVar26;
  undefined8 extraout_XMM0_Qb;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  block alVar35;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uchar **appuStack_b8 [4];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  long local_78;
  long local_70;
  ulong local_68;
  uint local_5c;
  undefined8 local_58;
  undefined1 (*local_50) [16];
  undefined8 local_48;
  undefined8 uStack_40;
  byte local_31;
  
  local_88._8_8_ = local_88._0_8_;
  uVar12 = CONCAT44(in_register_00000034,alpha);
  local_58 = CONCAT44(in_register_00000014,n);
  appuStack_b8[1] = (uchar **)&local_c8;
  local_48 = CONCAT44(local_48._4_4_,alpha);
  local_98 = (uchar **)(ulong)(n - 7);
  uVar5 = (ulong)(n - 6);
  local_50 = (undefined1 (*) [16])(uVar5 * 0x20);
  pauVar21 = (undefined1 (*) [16])(&local_c8 + uVar5 * -4);
  uVar23 = uVar5 * 8 + 0xf & 0xfffffffffffffff0;
  lVar11 = (long)pauVar21 - uVar23;
  local_78 = lVar11 + (long)local_98 * -0x10;
  lVar9 = local_78 - ((long)local_98 * 8 + 0xfU & 0xfffffffffffffff0);
  appuStack_b8[2] = k1;
  appuStack_b8[3] = k0;
  local_70 = lVar9;
  local_68 = uVar5;
  *(undefined8 *)(lVar9 + -8) = 0x10139f;
  pAVar15 = key;
  dpf_random_block();
  local_c8 = extraout_XMM0_Qa;
  uStack_c0 = extraout_XMM0_Qb;
  *(undefined8 *)(lVar9 + -8) = 0x1013ac;
  dpf_random_block();
  auVar33._8_8_ = uStack_c0;
  auVar33._0_8_ = local_c8;
  uVar16 = (uint)local_c8 & 1;
  local_5c = uVar16 ^ 1;
  *(uint *)((long)&local_c8 + (uVar5 * -0x20 - uVar23) + 4) = uVar16 ^ 1;
  auVar32 = ZEXT416(1);
  local_31 = (byte)local_c8 & 1;
  if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar33 = auVar33 ^ auVar32;
  }
  *pauVar21 = auVar33;
  auVar25 = extraout_XMM0;
  if ((extraout_XMM0 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    auVar25 = extraout_XMM0 ^ auVar32;
  }
  *(undefined1 (*) [16])((long)appuStack_b8[1] + (0x10 - (long)local_50)) = auVar25;
  local_50 = pauVar21;
  if (7 < (int)local_58) {
    alVar35 = key->rd_key[0];
    uVar26 = key->rounds;
    lVar10 = (ulong)uVar26 * 0x10;
    alVar3 = key->rd_key[uVar26];
    uVar12 = 1;
    local_88._0_8_ = lVar11;
    pauVar22 = pauVar21;
    do {
      if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar33 = auVar33 ^ auVar32;
      }
      auVar34 = auVar33 ^ (undefined1  [16])alVar35;
      auVar25 = auVar34 ^ auVar32;
      if (1 < uVar26) {
        lVar14 = 0x10;
        do {
          auVar27 = *(undefined1 (*) [16])((long)key->rd_key[0] + lVar14);
          auVar34 = aesenc(auVar34,auVar27);
          auVar25 = aesenc(auVar25,auVar27);
          lVar14 = lVar14 + 0x10;
        } while (lVar10 != lVar14);
      }
      auVar34 = aesenclast(auVar34,(undefined1  [16])alVar3);
      auVar34 = auVar34 ^ auVar33;
      uVar13 = auVar34._0_4_;
      if ((auVar34 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar34 = auVar34 ^ auVar32;
      }
      auVar27 = aesenclast(auVar25,(undefined1  [16])alVar3);
      auVar28 = auVar27 ^ auVar33 ^ auVar32;
      auVar25 = auVar28;
      if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar25 = auVar27 ^ auVar33;
      }
      lVar14 = uVar12 - 1;
      auVar33 = pauVar22[lVar14 * 2 + 1];
      if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar33 = auVar33 ^ auVar32;
      }
      auVar27 = auVar33 ^ (undefined1  [16])alVar35;
      auVar30 = auVar27 ^ auVar32;
      if (1 < uVar26) {
        lVar19 = 0x10;
        do {
          auVar29 = *(undefined1 (*) [16])((long)key->rd_key[0] + lVar19);
          auVar27 = aesenc(auVar27,auVar29);
          auVar30 = aesenc(auVar30,auVar29);
          lVar19 = lVar19 + 0x10;
        } while (lVar10 != lVar19);
      }
      auVar27 = aesenclast(auVar27,(undefined1  [16])alVar3);
      auVar27 = auVar27 ^ auVar33;
      uVar18 = auVar27._0_4_;
      if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar27 = auVar27 ^ auVar32;
      }
      auVar31 = aesenclast(auVar30,(undefined1  [16])alVar3);
      auVar29 = auVar31 ^ auVar33 ^ auVar32;
      auVar30 = auVar29;
      if ((auVar29 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar30 = auVar31 ^ auVar33;
      }
      uVar13 = uVar13 & 1;
      uVar17 = auVar28._0_4_ & 1;
      uVar18 = uVar18 & 1;
      uVar20 = auVar29._0_4_ & 1;
      bVar24 = ((uint)local_48 >> ((int)local_58 - (int)uVar12 & 0x1fU) & 1) != 0;
      auVar28 = auVar25;
      auVar33 = auVar30;
      if (bVar24) {
        auVar28 = auVar34;
        auVar33 = auVar27;
      }
      auVar28 = auVar28 ^ auVar33;
      *(undefined1 (*) [16])(local_78 + lVar14 * 0x10) = auVar28;
      auVar33 = auVar34;
      if (bVar24) {
        auVar33 = auVar25;
      }
      uVar23 = (ulong)bVar24;
      *(uint *)(local_70 + -8 + uVar12 * 8) = bVar24 ^ uVar13 ^ uVar18 ^ 1;
      *(uint *)(local_70 + -4 + uVar12 * 8) = bVar24 ^ uVar17 ^ uVar20;
      lVar14 = local_70 + lVar14 * 8;
      if (uVar16 == 1) {
        if (uVar23 == 0) {
          uVar17 = uVar13;
        }
        auVar33 = auVar33 ^ auVar28;
        uVar16 = uVar17 ^ *(uint *)(lVar14 + uVar23 * 4);
      }
      else {
        uVar16 = uVar17;
        if (uVar23 == 0) {
          uVar16 = uVar13;
        }
      }
      pAVar15 = (AES_KEY *)(uVar12 * 0x20);
      pauVar21[uVar12 * 2] = auVar33;
      *(uint *)(lVar11 + uVar12 * 8) = uVar16;
      if (uVar23 != 0) {
        auVar27 = auVar30;
      }
      if (*(int *)(lVar11 + -4 + uVar12 * 8) == 1) {
        auVar27 = auVar27 ^ auVar28;
        if (uVar23 == 0) {
          uVar20 = uVar18;
        }
        uVar20 = uVar20 ^ *(uint *)(lVar14 + uVar23 * 4);
      }
      else if (uVar23 == 0) {
        uVar20 = uVar18;
      }
      *(undefined1 (*) [16])((long)pAVar15->rd_key[0] + (long)(appuStack_b8 + uVar5 * -4)) = auVar27
      ;
      *(uint *)(lVar11 + 4 + uVar12 * 8) = uVar20;
      uVar12 = uVar12 + 1;
      pauVar22 = local_50;
    } while (uVar12 != local_68);
  }
  local_88 = auVar32;
  if ((local_48 & 0x40) != 0) {
    local_88 = _DAT_00103020;
  }
  if ((local_48 & 0x20) != 0) {
    lVar11 = local_88._8_8_;
    local_88._0_8_ = local_88._0_8_ << 0x20;
    local_88._8_8_ = lVar11 << 0x20;
  }
  if ((local_48 & 0x10) != 0) {
    lVar11 = local_88._8_8_;
    uVar23 = local_88._0_8_;
    local_88._0_8_ = uVar23 << 0x10;
    local_88._8_8_ = lVar11 << 0x10 | uVar23 >> 0x30;
  }
  if ((local_48 & 8) != 0) {
    lVar11 = local_88._8_8_;
    uVar23 = local_88._0_8_;
    local_88._0_8_ = uVar23 << 8;
    local_88._8_8_ = lVar11 << 8 | uVar23 >> 0x38;
  }
  if ((local_48 & 4) != 0) {
    auVar25._0_8_ = local_88._0_8_ << 4;
    auVar25._8_8_ = local_88._8_8_ << 4;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = local_88._0_8_ >> 0x3c;
    local_88 = auVar25 | auVar32 << 0x40;
  }
  if ((local_48 & 2) != 0) {
    auVar27._0_8_ = local_88._0_8_ << 2;
    auVar27._8_8_ = local_88._8_8_ << 2;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = local_88._0_8_ >> 0x3e;
    local_88 = auVar27 | auVar34 << 0x40;
  }
  if ((local_48 & 1) != 0) {
    auVar30._8_8_ = local_88._8_8_ * 2;
    auVar30._0_8_ = local_88._0_8_ * 2;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = local_88._0_8_ >> 0x3f;
    local_88 = auVar30 | auVar28 << 0x40;
  }
  *(undefined8 *)(lVar9 + -8) = 0x1016dc;
  alVar35[1] = uVar12;
  alVar35[0] = (longlong)pAVar15;
  dpf_cb(alVar35);
  lVar11 = (long)(int)(uint)local_98;
  local_48 = *(undefined8 *)pauVar21[lVar11 * 2];
  uStack_40 = *(undefined8 *)((long)pauVar21[lVar11 * 2] + 8);
  local_98 = appuStack_b8[uVar5 * -4 + lVar11 * 4];
  uStack_90 = (appuStack_b8 + uVar5 * -4 + lVar11 * 4)[1];
  lVar11 = lVar11 * 0x12;
  __size = (size_t)((int)lVar11 + 0x22);
  *(undefined8 *)(lVar9 + -8) = 0x101716;
  puVar6 = (uchar *)malloc(__size);
  *(undefined8 *)(lVar9 + -8) = 0x101721;
  puVar7 = (uchar *)malloc(__size);
  pauVar21 = local_50;
  if ((puVar6 != (uchar *)0x0) && (puVar7 != (uchar *)0x0)) {
    pauVar22 = local_50 + 1;
    *puVar6 = (uchar)local_58;
    uVar4 = *(undefined8 *)((long)*local_50 + 8);
    *(undefined8 *)(puVar6 + 1) = *(undefined8 *)*local_50;
    *(undefined8 *)(puVar6 + 9) = uVar4;
    puVar6[0x11] = local_31;
    if (7 < (int)local_58) {
      puVar8 = puVar6 + 0x23;
      lVar10 = 0;
      do {
        puVar1 = (undefined8 *)(local_78 + lVar10 * 2);
        uVar4 = puVar1[1];
        *(undefined8 *)(puVar8 + -0x11) = *puVar1;
        *(undefined8 *)(puVar8 + -9) = uVar4;
        puVar8[-1] = *(uchar *)(local_70 + lVar10);
        *puVar8 = *(uchar *)(local_70 + 4 + lVar10);
        puVar8 = puVar8 + 0x12;
        lVar10 = lVar10 + 8;
      } while (local_68 * 8 + -8 != lVar10);
    }
    uVar16 = (uint)local_48 ^ (uint)local_98 ^ local_88._0_4_;
    uVar26 = local_48._4_4_ ^ local_98._4_4_ ^ local_88._4_4_;
    uVar13 = (uint)uStack_40 ^ (uint)uStack_90 ^ local_88._8_4_;
    uVar18 = uStack_40._4_4_ ^ uStack_90._4_4_ ^ local_88._12_4_;
    local_48 = CONCAT44(uVar26,uVar16) ^ 1;
    uStack_40 = CONCAT44(uVar18,uVar13);
    puVar2 = (uint *)(puVar6 + lVar11 + 0x12);
    *puVar2 = uVar16 ^ 1;
    puVar2[1] = uVar26;
    puVar2[2] = uVar13;
    puVar2[3] = uVar18;
    *puVar7 = (uchar)local_58;
    *(undefined8 *)(lVar9 + -8) = 0x1017da;
    memcpy(puVar7 + 0x12,puVar6 + 0x12,(long)(int)lVar11);
    uVar4 = *(undefined8 *)((long)pauVar21[1] + 8);
    *(undefined8 *)(puVar7 + 1) = *(undefined8 *)*pauVar22;
    *(undefined8 *)(puVar7 + 9) = uVar4;
    puVar7[0x11] = (uchar)local_5c;
    *(ulong *)(puVar7 + lVar11 + 0x12) = local_48;
    *(ulong *)((long)(puVar7 + lVar11 + 0x12) + 8) = uStack_40;
    *appuStack_b8[3] = puVar6;
    *appuStack_b8[2] = puVar7;
    return;
  }
  *(undefined8 *)(lVar9 + -8) = 0x101822;
  puts("Memory allocation failed");
  *(code **)(lVar9 + -8) = EVAL;
  exit(1);
}

Assistant:

void GEN(AES_KEY *key, int alpha, int n, unsigned char** k0, unsigned char **k1){
	int maxlayer = n - 7;
	//int maxlayer = n;

	block s[maxlayer + 1][2];
	int t[maxlayer + 1 ][2];
	block sCW[maxlayer];
	int tCW[maxlayer][2];

	s[0][0] = dpf_random_block();
	s[0][1] = dpf_random_block();
	t[0][0] = dpf_lsb(s[0][0]);
	t[0][1] = t[0][0] ^ 1;
	s[0][0] = dpf_set_lsb_zero(s[0][0]);
	s[0][1] = dpf_set_lsb_zero(s[0][1]);

	int i;
	block s0[2], s1[2]; // 0=L,1=R
	#define LEFT 0
	#define RIGHT 1
	int t0[2], t1[2];
	for(i = 1; i<= maxlayer; i++){
		PRG(key, s[i-1][0], &s0[LEFT], &s0[RIGHT], &t0[LEFT], &t0[RIGHT]);
		PRG(key, s[i-1][1], &s1[LEFT], &s1[RIGHT], &t1[LEFT], &t1[RIGHT]);

		int keep, lose;
		int alphabit = getbit(alpha, n, i);
		if(alphabit == 0){
			keep = LEFT;
			lose = RIGHT;
		}else{
			keep = RIGHT;
			lose = LEFT;
		}

		sCW[i-1] = dpf_xor(s0[lose], s1[lose]);

		tCW[i-1][LEFT] = t0[LEFT] ^ t1[LEFT] ^ alphabit ^ 1;
		tCW[i-1][RIGHT] = t0[RIGHT] ^ t1[RIGHT] ^ alphabit;

		if(t[i-1][0] == 1){
			s[i][0] = dpf_xor(s0[keep], sCW[i-1]);
			t[i][0] = t0[keep] ^ tCW[i-1][keep];
		}else{
			s[i][0] = s0[keep];
			t[i][0] = t0[keep];
		}

		if(t[i-1][1] == 1){
			s[i][1] = dpf_xor(s1[keep], sCW[i-1]);
			t[i][1] = t1[keep] ^ tCW[i-1][keep];
		}else{
			s[i][1] = s1[keep];
			t[i][1] = t1[keep];
		}
	}

	block finalblock;
	finalblock = dpf_zero_block();
	finalblock = dpf_reverse_lsb(finalblock);

	char shift = (alpha) & 127;
	if(shift & 64){
		finalblock = dpf_left_shirt(finalblock, 64);
	}
	if(shift & 32){
		finalblock = dpf_left_shirt(finalblock, 32);
	}
	if(shift & 16){
		finalblock = dpf_left_shirt(finalblock, 16);
	}
	if(shift & 8){
		finalblock = dpf_left_shirt(finalblock, 8);
	}
	if(shift & 4){
		finalblock = dpf_left_shirt(finalblock, 4);
	}
	if(shift & 2){
		finalblock = dpf_left_shirt(finalblock, 2);
	}
	if(shift & 1){
		finalblock = dpf_left_shirt(finalblock, 1);
	}
	dpf_cb(finalblock);
	finalblock = dpf_reverse_lsb(finalblock);

	finalblock = dpf_xor(finalblock, s[maxlayer][0]);
	finalblock = dpf_xor(finalblock, s[maxlayer][1]);

	unsigned char *buff0;
	unsigned char *buff1;
	buff0 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);
	buff1 = (unsigned char*) malloc(1 + 16 + 1 + 18 * maxlayer + 16);

	if(buff0 == NULL || buff1 == NULL){
		printf("Memory allocation failed\n");
		exit(1);
	}

	buff0[0] = n;
	memcpy(&buff0[1], &s[0][0], 16);
	buff0[17] = t[0][0];
	for(i = 1; i <= maxlayer; i++){
		memcpy(&buff0[18 * i], &sCW[i-1], 16);
		buff0[18 * i + 16] = tCW[i-1][0];
		buff0[18 * i + 17] = tCW[i-1][1]; 
	}
	memcpy(&buff0[18 * maxlayer + 18], &finalblock, 16); 

	buff1[0] = n;
	memcpy(&buff1[18], &buff0[18], 18 * (maxlayer));
	memcpy(&buff1[1], &s[0][1], 16);
	buff1[17] = t[0][1];
	memcpy(&buff1[18 * maxlayer + 18], &finalblock, 16);

	*k0 = buff0;
	*k1 = buff1;
}